

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v6::internal::
       parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  align_t align;
  char *pcVar2;
  bool bVar3;
  basic_string_view<char> fill;
  
  pcVar2 = next_code_point<char>(begin,end);
  if (pcVar2 == end) {
    pcVar2 = begin;
  }
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '<') {
      align = left;
LAB_0012b705:
      fill.size_ = (long)pcVar2 - (long)begin;
      if (fill.size_ != 0) {
        if (*begin == '{') {
          specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        fill.data_ = begin;
        specs_setter<char>::on_fill((specs_setter<char> *)handler,fill);
        begin = pcVar2;
      }
      specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
      ::on_align(handler,align);
      return begin + 1;
    }
    if (cVar1 == '^') {
      align = center;
      goto LAB_0012b705;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_0012b705;
    }
    if (cVar1 == '=') {
      align = numeric;
      goto LAB_0012b705;
    }
    bVar3 = pcVar2 == begin;
    pcVar2 = begin;
    if (bVar3) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}